

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3AddCheckConstraint(Parse *pParse,Expr *pCheckExpr,char *zStart,char *zEnd)

{
  byte bVar1;
  sqlite3 *db;
  Table *pTVar2;
  ExprList *pList;
  byte *pbVar3;
  Token t;
  
  db = pParse->db;
  pTVar2 = pParse->pNewTable;
  if (((pTVar2 != (Table *)0x0) && (pParse->eParseMode != '\x01')) &&
     (((db->aDb[(db->init).iDb].pBt)->pBt->btsFlags & 1) == 0)) {
    pList = sqlite3ExprListAppend(pParse,pTVar2->pCheck,pCheckExpr);
    pTVar2->pCheck = pList;
    if ((pParse->constraintName).n != 0) {
      sqlite3ExprListSetName(pParse,pList,&pParse->constraintName,1);
      return;
    }
    t.n = ((int)zEnd - (int)zStart) + 1;
    do {
      pbVar3 = (byte *)(zStart + 1);
      zStart = zStart + 1;
      t.n = t.n - 1;
    } while ((""[*pbVar3] & 1) != 0);
    pbVar3 = (byte *)(zEnd + -1);
    do {
      bVar1 = *pbVar3;
      t.n = t.n - 1;
      pbVar3 = pbVar3 + -1;
    } while ((""[bVar1] & 1) != 0);
    t.z = zStart;
    sqlite3ExprListSetName(pParse,pList,&t,1);
    return;
  }
  sqlite3ExprDelete(db,pCheckExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddCheckConstraint(
  Parse *pParse,      /* Parsing context */
  Expr *pCheckExpr,   /* The check expression */
  const char *zStart, /* Opening "(" */
  const char *zEnd    /* Closing ")" */
){
#ifndef SQLITE_OMIT_CHECK
  Table *pTab = pParse->pNewTable;
  sqlite3 *db = pParse->db;
  if( pTab && !IN_DECLARE_VTAB
   && !sqlite3BtreeIsReadonly(db->aDb[db->init.iDb].pBt)
  ){
    pTab->pCheck = sqlite3ExprListAppend(pParse, pTab->pCheck, pCheckExpr);
    if( pParse->constraintName.n ){
      sqlite3ExprListSetName(pParse, pTab->pCheck, &pParse->constraintName, 1);
    }else{
      Token t;
      for(zStart++; sqlite3Isspace(zStart[0]); zStart++){}
      while( sqlite3Isspace(zEnd[-1]) ){ zEnd--; }
      t.z = zStart;
      t.n = (int)(zEnd - t.z);
      sqlite3ExprListSetName(pParse, pTab->pCheck, &t, 1);
    }
  }else
#endif
  {
    sqlite3ExprDelete(pParse->db, pCheckExpr);
  }
}